

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O2

err_t btokCVCCheck(btok_cvc_t *cvc)

{
  ulong uVar1;
  bool_t bVar2;
  err_t eVar3;
  bign_params bStack_178;
  
  bVar2 = memIsValid(cvc,0x128);
  if (bVar2 != 0) {
    bVar2 = btokCVCNameIsValid(cvc->authority);
    if (bVar2 == 0) {
      return 0x135;
    }
    bVar2 = btokCVCNameIsValid(cvc->holder);
    if (bVar2 == 0) {
      return 0x135;
    }
    bVar2 = tmDateIsValid2(cvc->from);
    if (bVar2 == 0) {
      return 0x134;
    }
    bVar2 = tmDateIsValid2(cvc->until);
    if (bVar2 == 0) {
      return 0x134;
    }
    bVar2 = tmDateLeq2(cvc->from,cvc->until);
    if (bVar2 == 0) {
      return 0x134;
    }
    uVar1 = cvc->pubkey_len;
    if ((uVar1 & 1) == 0) {
      eVar3 = btokParamsStd(&bStack_178,uVar1 >> 1);
      if (eVar3 != 0) {
        return eVar3;
      }
      if (uVar1 == 0x30) {
        eVar3 = bign96PubkeyVal(&bStack_178,cvc->pubkey);
        return eVar3;
      }
      eVar3 = bignPubkeyVal(&bStack_178,cvc->pubkey);
      return eVar3;
    }
  }
  return 0x6d;
}

Assistant:

err_t btokCVCCheck(const btok_cvc_t* cvc)
{
	if (!memIsValid(cvc, sizeof(btok_cvc_t)))
		return ERR_BAD_INPUT;
	if (!btokCVCNameIsValid(cvc->authority) || !btokCVCNameIsValid(cvc->holder))
		return ERR_BAD_NAME;
	if (!tmDateIsValid2(cvc->from) || !tmDateIsValid2(cvc->until) ||
		!tmDateLeq2(cvc->from, cvc->until))
		return ERR_BAD_DATE;
	return btokPubkeyVal(cvc->pubkey, cvc->pubkey_len);
}